

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type __thiscall QList<QItemSelectionRange>::takeLast(QList<QItemSelectionRange> *this)

{
  QPersistentModelIndexData *pQVar1;
  QItemSelectionRange *pQVar2;
  iterator iVar3;
  QPersistentModelIndex extraout_RDX;
  QList<QItemSelectionRange> *in_RSI;
  value_type vVar4;
  
  iVar3 = end(in_RSI);
  pQVar1 = iVar3.i[-1].tl.d;
  pQVar2 = (QItemSelectionRange *)iVar3.i[-1].br.d;
  iVar3.i[-1].tl.d = (QPersistentModelIndexData *)0x0;
  iVar3.i[-1].br.d = (QPersistentModelIndexData *)0x0;
  (this->d).d = (Data *)pQVar1;
  (this->d).ptr = pQVar2;
  QtPrivate::QGenericArrayOps<QItemSelectionRange>::eraseLast
            ((QGenericArrayOps<QItemSelectionRange> *)in_RSI);
  vVar4.br.d = extraout_RDX.d;
  vVar4.tl.d = (QPersistentModelIndexData *)this;
  return vVar4;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }